

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_memory_editor.h
# Opt level: O2

void __thiscall MemoryEditor::MemoryEditor(MemoryEditor *this)

{
  this->Open = true;
  this->ReadOnly = false;
  this->Cols = 0x10;
  this->OptShowOptions = true;
  this->OptShowDataPreview = false;
  this->OptShowHexII = false;
  this->OptShowAscii = true;
  this->OptGreyOutZeroes = true;
  this->OptUpperCaseHex = true;
  this->OptMidColsCount = 8;
  this->OptAddrDigitsCount = 0;
  this->OptFooterExtraHeight = 0.0;
  this->HighlightColor = 0x32ffffff;
  this->ContentsWidthChanged = false;
  this->HighlightFn = (_func_bool_ImU8_ptr_size_t_void_ptr *)0x0;
  this->ReadFn = (_func_ImU8_ImU8_ptr_size_t_void_ptr *)0x0;
  this->WriteFn = (_func_void_ImU8_ptr_size_t_ImU8_void_ptr *)0x0;
  *(undefined4 *)&this->DataPreviewAddr = 0xffffffff;
  *(undefined4 *)((long)&this->DataPreviewAddr + 4) = 0xffffffff;
  *(undefined4 *)&this->DataEditingAddr = 0xffffffff;
  *(undefined4 *)((long)&this->DataEditingAddr + 4) = 0xffffffff;
  this->DataEditingTakeFocus = false;
  this->DataInputBuf[0] = '\0';
  this->DataInputBuf[1] = '\0';
  this->DataInputBuf[2] = '\0';
  this->DataInputBuf[3] = '\0';
  this->DataInputBuf[4] = '\0';
  this->DataInputBuf[5] = '\0';
  this->DataInputBuf[6] = '\0';
  this->DataInputBuf[7] = '\0';
  this->DataInputBuf[8] = '\0';
  this->DataInputBuf[9] = '\0';
  this->DataInputBuf[10] = '\0';
  this->DataInputBuf[0xb] = '\0';
  this->DataInputBuf[0xc] = '\0';
  this->DataInputBuf[0xd] = '\0';
  this->DataInputBuf[0xe] = '\0';
  this->DataInputBuf[0xf] = '\0';
  this->DataInputBuf[0x10] = '\0';
  this->DataInputBuf[0x11] = '\0';
  this->DataInputBuf[0x12] = '\0';
  this->DataInputBuf[0x13] = '\0';
  this->DataInputBuf[0x14] = '\0';
  this->DataInputBuf[0x15] = '\0';
  this->DataInputBuf[0x16] = '\0';
  this->DataInputBuf[0x17] = '\0';
  this->DataInputBuf[0x18] = '\0';
  this->DataInputBuf[0x19] = '\0';
  this->DataInputBuf[0x1a] = '\0';
  this->DataInputBuf[0x1b] = '\0';
  this->DataInputBuf[0x1c] = '\0';
  this->DataInputBuf[0x1d] = '\0';
  this->DataInputBuf[0x1e] = '\0';
  *(undefined8 *)(this->DataInputBuf + 0x1f) = 0;
  this->AddrInputBuf[7] = '\0';
  this->AddrInputBuf[8] = '\0';
  this->AddrInputBuf[9] = '\0';
  this->AddrInputBuf[10] = '\0';
  this->AddrInputBuf[0xb] = '\0';
  this->AddrInputBuf[0xc] = '\0';
  this->AddrInputBuf[0xd] = '\0';
  this->AddrInputBuf[0xe] = '\0';
  this->AddrInputBuf[0xf] = '\0';
  this->AddrInputBuf[0x10] = '\0';
  this->AddrInputBuf[0x11] = '\0';
  this->AddrInputBuf[0x12] = '\0';
  this->AddrInputBuf[0x13] = '\0';
  this->AddrInputBuf[0x14] = '\0';
  this->AddrInputBuf[0x15] = '\0';
  this->AddrInputBuf[0x16] = '\0';
  this->AddrInputBuf[0x17] = '\0';
  this->AddrInputBuf[0x18] = '\0';
  this->AddrInputBuf[0x19] = '\0';
  this->AddrInputBuf[0x1a] = '\0';
  this->AddrInputBuf[0x1b] = '\0';
  this->AddrInputBuf[0x1c] = '\0';
  this->AddrInputBuf[0x1d] = '\0';
  this->AddrInputBuf[0x1e] = '\0';
  this->AddrInputBuf[0x1f] = '\0';
  this->HighlightMax = 0xffffffffffffffff;
  *(undefined4 *)&this->GotoAddr = 0xffffffff;
  *(undefined4 *)((long)&this->GotoAddr + 4) = 0xffffffff;
  *(undefined4 *)&this->HighlightMin = 0xffffffff;
  *(undefined4 *)((long)&this->HighlightMin + 4) = 0xffffffff;
  this->PreviewEndianess = 0;
  this->PreviewDataType = 4;
  return;
}

Assistant:

MemoryEditor()
    {
        // Settings
        Open = true;
        ReadOnly = false;
        Cols = 16;
        OptShowOptions = true;
        OptShowDataPreview = false;
        OptShowHexII = false;
        OptShowAscii = true;
        OptGreyOutZeroes = true;
        OptUpperCaseHex = true;
        OptMidColsCount = 8;
        OptAddrDigitsCount = 0;
        OptFooterExtraHeight = 0.0f;
        HighlightColor = IM_COL32(255, 255, 255, 50);
        ReadFn = NULL;
        WriteFn = NULL;
        HighlightFn = NULL;

        // State/Internals
        ContentsWidthChanged = false;
        DataPreviewAddr = DataEditingAddr = (size_t)-1;
        DataEditingTakeFocus = false;
        memset(DataInputBuf, 0, sizeof(DataInputBuf));
        memset(AddrInputBuf, 0, sizeof(AddrInputBuf));
        GotoAddr = (size_t)-1;
        HighlightMin = HighlightMax = (size_t)-1;
        PreviewEndianess = 0;
        PreviewDataType = ImGuiDataType_S32;
    }